

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
::Node(Node<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>
       *this,pair<unsigned_long,_duckdb::date_t> *value,_Pool *param_3)

{
  date_t dVar1;
  undefined4 uVar2;
  
  dVar1.days = (value->second).days;
  uVar2 = *(undefined4 *)&value->field_0xc;
  (this->_value).first = value->first;
  (this->_value).second = (date_t)dVar1.days;
  *(undefined4 *)&(this->_value).field_0xc = uVar2;
  (this->_nodeRefs)._nodes.
  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_nodeRefs)._nodes.
  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_nodeRefs)._nodes.
  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::date_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::date_t>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_nodeRefs)._swapLevel = 0;
  this->_pool = param_3;
  Initialize(this,value);
  return;
}

Assistant:

Node<T, _Compare>::Node(const T &value, _Compare _cmp, _Pool &pool) : \
    _value(value), _compare(_cmp), _pool(pool) {
    Initialize(value);
}